

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O1

void Ptex::v2_2::PtexUtils::genRfaceids
               (FaceInfo *faces,int nfaces,uint32_t *rfaceids,uint32_t *faceids)

{
  undefined1 auVar1 [16];
  long lVar2;
  uint *__buffer;
  ulong uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  pair<unsigned_int_*,_long> pVar8;
  
  auVar1 = _DAT_0011f7f0;
  if (0 < nfaces) {
    lVar4 = (ulong)(uint)nfaces - 1;
    auVar5._8_4_ = (int)lVar4;
    auVar5._0_8_ = lVar4;
    auVar5._12_4_ = (int)((ulong)lVar4 >> 0x20);
    uVar3 = 0;
    auVar5 = auVar5 ^ _DAT_0011f7f0;
    auVar6 = _DAT_0011f7e0;
    do {
      auVar7 = auVar6 ^ auVar1;
      if ((bool)(~(auVar7._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar7._0_4_ ||
                  auVar5._4_4_ < auVar7._4_4_) & 1)) {
        faceids[uVar3] = (uint32_t)uVar3;
      }
      if ((auVar7._12_4_ != auVar5._12_4_ || auVar7._8_4_ <= auVar5._8_4_) &&
          auVar7._12_4_ <= auVar5._12_4_) {
        faceids[uVar3 + 1] = (uint32_t)uVar3 + 1;
      }
      uVar3 = uVar3 + 2;
      lVar4 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar4 + 2;
    } while ((nfaces + 1U & 0xfffffffe) != uVar3);
  }
  if (nfaces != 0) {
    lVar2 = (long)nfaces;
    pVar8 = std::get_temporary_buffer<unsigned_int>
                      ((long)(int)((lVar2 - (lVar2 + 1 >> 0x3f)) + 1U >> 1));
    lVar4 = pVar8.second;
    __buffer = pVar8.first;
    if (__buffer == (uint *)0x0) {
      std::
      __inplace_stable_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_comp_iter<Ptex::v2_2::PtexUtils::(anonymous_namespace)::CompareRfaceIds>>
                (faceids,faceids + lVar2,
                 (_Iter_comp_iter<Ptex::v2_2::PtexUtils::(anonymous_namespace)::CompareRfaceIds>)
                 faces);
      lVar4 = 0;
    }
    else {
      std::
      __stable_sort_adaptive<unsigned_int*,unsigned_int*,long,__gnu_cxx::__ops::_Iter_comp_iter<Ptex::v2_2::PtexUtils::(anonymous_namespace)::CompareRfaceIds>>
                (faceids,faceids + lVar2,__buffer,lVar4,
                 (_Iter_comp_iter<Ptex::v2_2::PtexUtils::(anonymous_namespace)::CompareRfaceIds>)
                 faces);
    }
    operator_delete(__buffer,lVar4 << 2);
  }
  if (0 < nfaces) {
    uVar3 = 0;
    do {
      rfaceids[faceids[uVar3]] = (uint32_t)uVar3;
      uVar3 = uVar3 + 1;
    } while ((uint)nfaces != uVar3);
  }
  return;
}

Assistant:

void genRfaceids(const FaceInfo* faces, int nfaces,
                 uint32_t* rfaceids, uint32_t* faceids)
{
    // stable_sort faceids by smaller dimension (u or v) in descending order
    // treat const faces as having res of 1

    // init faceids
    for (int i = 0; i < nfaces; i++) faceids[i] = i;

    // sort faceids by rfaceid
    std::stable_sort(faceids, faceids + nfaces, CompareRfaceIds(faces));

    // generate mapping from faceid to rfaceid
    for (int i = 0; i < nfaces; i++) {
        // note: i is the rfaceid
        rfaceids[faceids[i]] = i;
    }
}